

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O2

void __thiscall rest_rpc::rpc_service::rpc_server::do_accept(rpc_server *this)

{
  connection *this_00;
  io_context *io_service;
  anon_class_8_1_8991fb9c local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  this_00 = (connection *)operator_new(0x1e0);
  io_service = io_service_pool::get_io_service(&this->io_service_pool_);
  connection::connection(this_00,io_service,this->timeout_seconds_,&this->router_);
  std::__shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>::
  reset<rest_rpc::rpc_service::connection>
            (&(this->conn_).
              super___shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>,
             this_00);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/rpc_server.h:99:25)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/rpc_server.h:99:25)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>)>
  ::operator=(&((this->conn_).
                super___shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->callback_,
              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>)>
               *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  local_38.this = this;
  asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
  async_accept<asio::ip::tcp,asio::any_io_executor,rest_rpc::rpc_service::rpc_server::do_accept()::_lambda(std::error_code)_1_>
            ((basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *)&this->acceptor_,
             &(((this->conn_).
                super___shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,&local_38,
             0);
  return;
}

Assistant:

void do_accept() {
    conn_.reset(new connection(io_service_pool_.get_io_service(),
                               timeout_seconds_, router_));
    conn_->set_callback([this](std::string key, std::string token,
                               std::weak_ptr<connection> conn) {
      std::unique_lock<std::mutex> lock(sub_mtx_);
      sub_map_.emplace(std::move(key) + token, conn);
      if (!token.empty()) {
        token_list_.emplace(std::move(token));
      }
    });

    acceptor_.async_accept(conn_->socket(), [this](asio::error_code ec) {
      if (!acceptor_.is_open()) {
        return;
      }

      if (ec) {
        // LOG(INFO) << "acceptor error: " <<
        // ec.message();
      } else {
#ifdef CINATRA_ENABLE_SSL
        if (!ssl_conf_.cert_file.empty()) {
          conn_->init_ssl_context(ssl_conf_);
        }
#endif
        if (on_net_err_callback_) {
          conn_->on_network_error(on_net_err_callback_);
        }
        conn_->start();
        std::unique_lock<std::mutex> lock(mtx_);
        conn_->set_conn_id(conn_id_);
        connections_.emplace(conn_id_++, conn_);
      }

      do_accept();
    });
  }